

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

dis_res * do_dis(decoctx *deco,uint32_t cur)

{
  int iVar1;
  dis_res *status;
  easm_insn *peVar2;
  bool bVar3;
  uint local_5c;
  int stride;
  int i;
  dis_res *res;
  disctx *ctx;
  disctx c;
  uint32_t cur_local;
  decoctx *deco_local;
  
  c._44_4_ = cur;
  memset(&ctx,0,0x30);
  status = (dis_res *)calloc(0x48,1);
  iVar1 = ed_getcstride(deco->isa,deco->varinfo);
  local_5c = 0;
  while( true ) {
    bVar3 = false;
    if ((int)local_5c < 0x10) {
      bVar3 = (uint)(c._44_4_ + (int)local_5c / iVar1) < deco->codesz;
    }
    if (!bVar3) break;
    status->a[(int)local_5c / 8] =
         (ulong)deco->code[c._44_4_ * iVar1 + local_5c] << (sbyte)((local_5c & 7) << 3) |
         status->a[(int)local_5c / 8];
    local_5c = local_5c + 1;
  }
  ctx = (disctx *)deco->isa;
  c.isa = (disisa *)deco->varinfo;
  if ((deco->isa->tsched == (insn *)0x0) || ((uint)c._44_4_ % (uint)deco->isa->schedpos != 0)) {
    atomtab_d((disctx *)&ctx,status->a,status->m,deco->isa->troot);
  }
  else {
    atomtab_d((disctx *)&ctx,status->a,status->m,deco->isa->tsched);
  }
  status->oplen = (uint32_t)c.varinfo;
  if (deco->codesz < status->oplen + c._44_4_) {
    status->status = status->status | DIS_STATUS_EOF;
  }
  if (status->oplen == 0) {
    status->status = status->status | DIS_STATUS_UNK_FORM;
    status->oplen = *(uint32_t *)((long)&ctx->varinfo + 4);
  }
  status->endmark = c.atomsnum;
  peVar2 = dis_parse_insn((disctx *)&ctx,(dis_status *)status);
  status->insn = peVar2;
  for (local_5c = 0; (int)local_5c < (int)c.atoms; local_5c = local_5c + 1) {
    free(*(void **)(c._16_8_ + (long)(int)local_5c * 8));
  }
  free((void *)c._16_8_);
  return status;
}

Assistant:

struct dis_res *do_dis(struct decoctx *deco, uint32_t cur) {
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	struct dis_res *res = calloc(sizeof *res, 1);
	int i;
	int stride = ed_getcstride(deco->isa, deco->varinfo);
	for (i = 0; i < MAXOPLEN*8 && cur + i/stride < deco->codesz; i++) {
		res->a[i/8] |= (ull)deco->code[cur*stride + i] << (i&7)*8;
	}
	ctx->isa = deco->isa;
	ctx->varinfo = deco->varinfo;
	if (deco->isa->tsched && (cur % deco->isa->schedpos) == 0)
		atomtab_d (ctx, res->a, res->m, deco->isa->tsched);
	else
		atomtab_d (ctx, res->a, res->m, deco->isa->troot);
	res->oplen = ctx->oplen;
	if (res->oplen + cur > deco->codesz)
		res->status |= DIS_STATUS_EOF;
	if (res->oplen == 0) {
		res->status |= DIS_STATUS_UNK_FORM;
		res->oplen = ctx->isa->opunit;
	}
	res->endmark = ctx->endmark;
	/* XXX unused status */
	res->insn = dis_parse_insn(ctx, &res->status);

	for (i = 0; i < ctx->atomsnum; ++i)
		free(ctx->atoms[i]);
	free(ctx->atoms);

	return res;
}